

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SingleBindingCase::createShader(SingleBindingCase *this)

{
  bool bVar1;
  RenderContext *renderCtx;
  ShaderProgram *this_00;
  ostream *poVar2;
  ProgramSources *pPVar3;
  TestError *this_01;
  char *pcVar4;
  allocator<char> local_2d9;
  string local_2d8;
  string local_2b8;
  undefined1 local_298 [40];
  undefined1 local_270 [376];
  ProgramSources local_f8;
  
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_BindingRenderCase).super_TestCase.m_context)->m_renderCtx;
  memset(&local_f8,0,0xac);
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_f8.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_f8._193_8_ = 0;
  bVar1 = (this->m_spec).hasColorAttr;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_270);
  std::operator<<((ostream *)local_270,"#version 310 es\nin highp vec4 a_position;\n");
  pcVar4 = "uniform highp vec4 u_color;\n";
  if (bVar1 != false) {
    pcVar4 = "in highp vec4 a_color;\n";
  }
  std::operator<<((ostream *)local_270,pcVar4);
  poVar2 = std::operator<<((ostream *)local_270,
                           "out highp vec4 v_color;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_color = "
                          );
  pcVar4 = "u_color";
  if (bVar1 != false) {
    pcVar4 = "a_color";
  }
  poVar2 = std::operator<<(poVar2,pcVar4);
  std::operator<<(poVar2,";\n}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_270);
  glu::VertexSource::VertexSource((VertexSource *)local_298,&local_2b8);
  pPVar3 = glu::ProgramSources::operator<<(&local_f8,(ShaderSource *)local_298);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d8,
             "#version 310 es\nin mediump vec4 v_color;\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tfragColor = v_color;\n}\n"
             ,&local_2d9);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_270,&local_2d8);
  pPVar3 = glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_270);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,pPVar3);
  (this->super_BindingRenderCase).m_program = this_00;
  std::__cxx11::string::~string((string *)(local_270 + 8));
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)(local_298 + 8));
  std::__cxx11::string::~string((string *)&local_2b8);
  glu::ProgramSources::~ProgramSources(&local_f8);
  glu::operator<<(((this->super_BindingRenderCase).super_TestCase.super_TestCase.super_TestNode.
                  m_testCtx)->m_log,(this->super_BindingRenderCase).m_program);
  if ((((this->super_BindingRenderCase).m_program)->m_program).m_info.linkOk != false) {
    return;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_270,"could not build shader",(allocator<char> *)&local_f8);
  tcu::TestError::TestError(this_01,(string *)local_270);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void SingleBindingCase::createShader (void)
{
	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::ProgramSources() << glu::VertexSource(genVertexSource()) << glu::FragmentSource(s_colorFragmentShader));
	m_testCtx.getLog() << *m_program;

	if (!m_program->isOk())
		throw tcu::TestError("could not build shader");
}